

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IterativeAlgorithm.cpp
# Opt level: O1

void __thiscall
van_kampen::IterativeAlgorithm::generate
          (IterativeAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words_)

{
  size_t sVar1;
  ostream *poVar2;
  size_t *psVar3;
  ulong uVar4;
  bool isAdditionForced;
  size_t increase;
  size_t totalIterations;
  vector<bool,_std::allocator<bool>_> isAdded;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  words;
  anon_class_56_7_b2ce0729 iterateOverWordsOnce;
  ProcessLogger logger;
  bool local_111;
  size_t local_110;
  ulong local_108;
  vector<bool,_std::allocator<bool>_> local_100;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  local_d8;
  undefined1 local_c0 [32];
  IterativeAlgorithm *local_a0;
  bool *local_98;
  size_t *local_90;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_88;
  ProcessLogger local_70;
  
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::vector(&local_d8,words_);
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>*,std::vector<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>,std::allocator<std::vector<van_kampen::GroupElement,std::allocator<van_kampen::GroupElement>>>>>>
            (local_d8.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             local_d8.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  uVar4 = ((long)local_d8.
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_d8.
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_108 = uVar4;
  if (this->cellsLimit != 0) {
    psVar3 = &this->cellsLimit;
    if (uVar4 <= this->cellsLimit) {
      psVar3 = &local_108;
    }
    local_108 = *psVar3;
  }
  local_70.total_._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_100,uVar4,(bool *)&local_70,(allocator_type *)local_c0);
  uVar4 = local_108;
  local_111 = false;
  local_c0._0_8_ = local_c0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Relations used","");
  ProcessLogger::ProcessLogger(&local_70,uVar4,(ostream *)&std::clog,(string *)local_c0,this->quiet)
  ;
  if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
    operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
  }
  local_110 = 0;
  *local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
   super__Bit_iterator_base._M_p =
       *local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p | 1;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_88,
             local_d8.
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  Diagramm::bindWord(&this->diagramm_,&local_88,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_88);
  ProcessLogger::iterate(&local_70);
  local_c0._16_8_ = &local_108;
  local_98 = &local_111;
  local_90 = &local_110;
  local_110 = 1;
  local_c0._0_8_ = &local_d8;
  local_c0._8_8_ = &local_70;
  local_c0._24_8_ = &local_100;
  local_a0 = this;
  while (local_110 != 0) {
    local_110 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_c0);
  }
  local_111 = true;
  local_110 = 1;
  while (local_110 != 0) {
    local_110 = 0;
    generate::anon_class_56_7_b2ce0729::operator()((anon_class_56_7_b2ce0729 *)local_c0);
  }
  sVar1 = ProcessLogger::getIteration(&local_70);
  if ((sVar1 < local_108) && (this->quiet == false)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"can not bind ",0xd);
    ProcessLogger::getIteration(&local_70);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," relations, finishing",0x15);
  }
  ProcessLogger::~ProcessLogger(&local_70);
  if (local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (ulong *)0x0;
    local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_100.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  ::~vector(&local_d8);
  return;
}

Assistant:

void IterativeAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words_)
{
    auto words = words_;
    std::reverse(words.begin(), words.end());
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    std::vector<bool> isAdded(words.size());
    bool isAdditionForced = false;
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);
    std::size_t increase = 0;
    isAdded.front() = true;
    diagramm_.bindWord(words.front(), false, true);
    logger.iterate();
    auto iterateOverWordsOnce = [&]() {
        for (std::size_t i = 0; i < words.size(); ++i)
        {
            if (logger.getIteration() >= totalIterations)
            {
                break;
            }
            if (isAdded[i])
                continue;
            if (diagramm_.bindWord(words[i], isAdditionForced, false))
            {
                isAdded[i] = true;
                increase += 1;
                if (logger.iterate() >= totalIterations)
                {
                    break;
                }
            }
        }
    };
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    isAdditionForced = true;
    increase = 1;
    while (increase)
    {
        increase = 0;
        iterateOverWordsOnce();
    }
    if (logger.getIteration() < totalIterations && !quiet)
    {
        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
    }
}